

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm.c
# Opt level: O0

double * inform_tpm(int *series,size_t n,size_t m,int b,double *tpm,inform_error *err)

{
  _Bool _Var1;
  int iVar2;
  int local_70;
  int local_6c;
  int j_2;
  int j_1;
  double sum;
  ulong uStack_58;
  int i_1;
  size_t j;
  size_t i;
  int future;
  int current;
  inform_error *err_local;
  double *tpm_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else {
    series_local = (int *)setup_tpm(tpm,b,err);
    if ((double *)series_local == (double *)0x0) {
      series_local = (int *)0x0;
    }
    else {
      for (j = 0; j < n; j = j + 1) {
        for (uStack_58 = 0; uStack_58 < m - 1; uStack_58 = uStack_58 + 1) {
          iVar2 = b * series[m * j + uStack_58] + series[m * j + uStack_58 + 1];
          *(double *)((long)series_local + (long)iVar2 * 8) =
               *(double *)((long)series_local + (long)iVar2 * 8) + 1.0;
        }
      }
      for (sum._4_4_ = 0; sum._4_4_ < b; sum._4_4_ = sum._4_4_ + 1) {
        _j_2 = 0.0;
        for (local_6c = 0; local_6c < b; local_6c = local_6c + 1) {
          _j_2 = *(double *)((long)series_local + (long)(b * sum._4_4_ + local_6c) * 8) + _j_2;
        }
        if ((_j_2 != 0.0) || (NAN(_j_2))) {
          for (local_70 = 0; local_70 < b; local_70 = local_70 + 1) {
            iVar2 = b * sum._4_4_ + local_70;
            *(double *)((long)series_local + (long)iVar2 * 8) =
                 *(double *)((long)series_local + (long)iVar2 * 8) / _j_2;
          }
        }
        else if (err != (inform_error *)0x0) {
          *err = INFORM_ETPMROW;
        }
      }
    }
  }
  return (double *)series_local;
}

Assistant:

double *inform_tpm(int const *series, size_t n, size_t m, int b, double *tpm,
    inform_error *err)
{
    if (check_arguments(series, n, m, b, err))
        return NULL;

    if ((tpm = setup_tpm(tpm, b, err)) == NULL)
        return NULL;

    int current = 0, future = 0;
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < m - 1; ++j)
        {
            current = series[m * i + j];
            future = series[m * i + j + 1];
            tpm[b * current + future] += 1;
        }
    }

    for (int i = 0; i < b; ++i)
    {
        double sum = 0.0;
        for (int j = 0; j < b; ++j)
            sum += tpm[b * i + j];

        if (sum != 0.0)
        {
            for (int j = 0; j < b; ++j)
            {
                tpm[b * i + j] /= sum;
            }
        }
        else
        {
            INFORM_ERROR(err, INFORM_ETPMROW);
        }
    }

    return tpm;
}